

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O0

Task * __thiscall tf::Task::precede<tf::Task&>(Task *this,Task *tasks)

{
  Task *in_RDI;
  
  Node::_precede((Node *)this,(Node *)tasks);
  return in_RDI;
}

Assistant:

Task& Task::precede(Ts&&... tasks) {
  (_node->_precede(tasks._node), ...);
  //_precede(std::forward<Ts>(tasks)...);
  return *this;
}